

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoeffBasedProduct.h
# Opt level: O2

Scalar __thiscall
Eigen::
CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_6>
::coeff(CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_6>
        *this,Index row,Index col)

{
  type pMVar1;
  Nested pMVar2;
  
  pMVar1 = this->m_lhs;
  pMVar2 = (this->m_rhs).m_matrix;
  return (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[row + 6] *
         (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[col + 6] +
         (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[row + 3] *
         (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[col + 3] +
         (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[row] *
         (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[col];
}

Assistant:

EIGEN_STRONG_INLINE const Scalar coeff(Index row, Index col) const
    {
      Scalar res;
      ScalarCoeffImpl::run(row, col, m_lhs, m_rhs, res);
      return res;
    }